

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dice.cpp
# Opt level: O1

void __thiscall Dice::Dice(Dice *this)

{
  time_t tVar1;
  DiceEffectsObserver *this_00;
  long lVar2;
  long *plVar3;
  initializer_list<std::pair<const_Dice::DiceOptions,_int>_> __l;
  initializer_list<std::pair<const_Dice::DiceOptions,_int>_> __l_00;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Dice::DiceOptions>_>
  __l_01;
  vector<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>
  historyOfRolls;
  map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  DiceValues;
  allocator_type local_151 [9];
  vector<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>
  local_148;
  map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  *local_130;
  undefined1 local_128 [32];
  _Base_ptr local_108;
  undefined1 *apuStack_100 [2];
  undefined1 local_f0 [16];
  undefined4 local_e0;
  undefined1 *local_d8 [2];
  undefined1 local_c8 [16];
  undefined4 local_b8;
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  undefined4 local_90;
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  undefined4 local_68;
  long *local_60 [2];
  long local_50 [2];
  undefined4 local_40;
  
  Subject::Subject(&this->super_Subject);
  (this->super_Subject)._vptr_Subject = (_func_int **)&PTR_attach_001268f0;
  this->DiceNames[0] = "Energy";
  this->DiceNames[1] = "Attack";
  this->DiceNames[2] = "Destruction";
  this->DiceNames[3] = "Heal";
  this->DiceNames[4] = "Celebrity";
  this->DiceNames[5] = "Ouch";
  local_108 = (_Base_ptr)0x4;
  apuStack_100[0] = (undefined1 *)0x5;
  local_128._16_8_ = 2;
  local_128._24_8_ = 3;
  local_128._0_4_ = Energy;
  local_128._4_4_ = 0;
  local_128._8_8_ = 1;
  __l._M_len = 6;
  __l._M_array = (iterator)local_128;
  std::
  map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  ::map(&this->DiceValues,__l,(less<Dice::DiceOptions> *)&local_148,local_151);
  local_108 = (_Base_ptr)0x4;
  apuStack_100[0] = (undefined1 *)0x5;
  local_128._16_8_ = 2;
  local_128._24_8_ = 3;
  local_128._0_4_ = Energy;
  local_128._4_4_ = 0;
  local_128._8_8_ = 1;
  __l_00._M_len = 6;
  __l_00._M_array = (iterator)local_128;
  local_130 = &this->DiceValues;
  std::
  map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  ::map(&this->resolvedHand,__l_00,(less<Dice::DiceOptions> *)&local_148,local_151);
  this->totalDiceValues[0] = 0;
  this->totalDiceValues[1] = 0;
  this->totalDiceValues[2] = 0;
  this->totalDiceValues[3] = 0;
  (this->historyOfRolls).
  super__Vector_base<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->it)._M_current =
       (map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
        *)0x0;
  (this->historyOfRolls).
  super__Vector_base<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->historyOfRolls).
  super__Vector_base<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->historyOfResolvedRolls).
  super__Vector_base<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->historyOfResolvedRolls).
  super__Vector_base<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mapIt)._M_node = (_Base_ptr)0x0;
  (this->historyOfResolvedRolls).
  super__Vector_base<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  this->totalDiceValues[4] = 0;
  this->totalDiceValues[5] = 0;
  local_128._0_8_ = (long)local_128 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"A","");
  local_108 = (_Base_ptr)CONCAT44(local_108._4_4_,Attack);
  apuStack_100[0] = local_f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)apuStack_100,"E","");
  local_e0 = 0;
  local_d8[0] = local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"D","");
  local_b8 = 2;
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"H","");
  local_90 = 3;
  local_88[0] = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"C","");
  local_68 = 4;
  plVar3 = local_50;
  local_60[0] = plVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"O","");
  local_40 = 5;
  __l_01._M_len = 6;
  __l_01._M_array = (iterator)local_128;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Dice::DiceOptions,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Dice::DiceOptions>_>_>
  ::map(&this->diceMap,__l_01,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &local_148,(allocator_type *)local_151);
  lVar2 = -0xf0;
  do {
    if (plVar3 != (long *)plVar3[-2]) {
      operator_delete((long *)plVar3[-2],*plVar3 + 1);
    }
    plVar3 = plVar3 + -5;
    lVar2 = lVar2 + 0x28;
  } while (lVar2 != 0);
  tVar1 = time((time_t *)0x0);
  srand((uint)tVar1);
  this->numberOfRolls = 3;
  local_128._24_8_ = local_128 + 8;
  local_128._8_8_ = local_128._8_8_ & 0xffffffff00000000;
  local_128._16_8_ = 0;
  apuStack_100[0] = (undefined1 *)0x0;
  local_148.
  super__Vector_base<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_148.
  super__Vector_base<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.
  super__Vector_base<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108 = (_Base_ptr)local_128._24_8_;
  this_00 = (DiceEffectsObserver *)operator_new(0x10);
  DiceEffectsObserver::DiceEffectsObserver(this_00,&this->super_Subject);
  (**(this->super_Subject)._vptr_Subject)(this,this_00);
  std::
  vector<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>
  ::~vector(&local_148);
  std::
  _Rb_tree<Dice::DiceOptions,_std::pair<const_Dice::DiceOptions,_int>,_std::_Select1st<std::pair<const_Dice::DiceOptions,_int>_>,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  ::~_Rb_tree((_Rb_tree<Dice::DiceOptions,_std::pair<const_Dice::DiceOptions,_int>,_std::_Select1st<std::pair<const_Dice::DiceOptions,_int>_>,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
               *)local_128);
  return;
}

Assistant:

Dice::Dice() {
    srand((unsigned)time(0));
    numberOfRolls = 3;

    map<DiceOptions, int> DiceValues;
    vector< map < DiceOptions, int> > historyOfRolls;

    vector< map < DiceOptions, int> > ::iterator it;

    // Attach the observer
    attach(new DiceEffectsObserver(this));

}